

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * pointer(dmr_C *C,token *token,decl_state *ctx)

{
  int iVar1;
  symbol *psVar2;
  symbol *ptr;
  decl_state *ctx_local;
  token *token_local;
  dmr_C *C_local;
  
  ctx_local = (decl_state *)token;
  while( true ) {
    iVar1 = dmrC_match_op((token *)ctx_local,0x2a);
    if (iVar1 == 0) break;
    psVar2 = dmrC_alloc_symbol(C->S,(position)(ctx_local->ctype).modifiers,4);
    (psVar2->field_14).field_2.ctype.modifiers = (ctx->ctype).modifiers;
    (psVar2->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
    *(uint *)((long)&psVar2->field_14 + 0x30) = (ctx->ctype).as;
    (psVar2->field_14).field_2.ctype.contexts = (ctx->ctype).contexts;
    (ctx->ctype).modifiers = 0;
    (ctx->ctype).base_type = psVar2;
    (ctx->ctype).as = 0;
    (ctx->ctype).contexts = (context_list *)0x0;
    (ctx->ctype).alignment = 0;
    ctx_local = (decl_state *)handle_qualifiers(C,(token *)(ctx_local->ctype).alignment,ctx);
    ((ctx->ctype).base_type)->endpos = (position)(ctx_local->ctype).modifiers;
  }
  return (token *)ctx_local;
}

Assistant:

static struct token *pointer(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	while (dmrC_match_op(token,'*')) {
		struct symbol *ptr = dmrC_alloc_symbol(C->S, token->pos, SYM_PTR);
		ptr->ctype.modifiers = ctx->ctype.modifiers;
		ptr->ctype.base_type = ctx->ctype.base_type;
		ptr->ctype.as = ctx->ctype.as;
		ptr->ctype.contexts = ctx->ctype.contexts;
		ctx->ctype.modifiers = 0;
		ctx->ctype.base_type = ptr;
		ctx->ctype.as = 0;
		ctx->ctype.contexts = NULL;
		ctx->ctype.alignment = 0;

		token = handle_qualifiers(C, token->next, ctx);
		ctx->ctype.base_type->endpos = token->pos;
	}
	return token;
}